

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[18],capnp::Text::Reader>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [18],
          Reader *params_1)

{
  Reader *params_00;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> argValues_00;
  ArrayDisposer **local_b0;
  undefined1 local_58 [8];
  String argValues [2];
  Reader *params_local_1;
  char (*params_local) [18];
  char *macroArgs_local;
  
  argValues[1].content.disposer = (ArrayDisposer *)params;
  str<char_const(&)[18]>((String *)local_58,(kj *)macroArgs,(char (*) [18])macroArgs);
  str<capnp::Text::Reader&>
            ((String *)&argValues[0].content.disposer,(kj *)argValues[1].content.disposer,params_00)
  ;
  AVar1 = arrayPtr<kj::String>((String *)local_58,2);
  argValues_00.size_ = (size_t)params_1;
  argValues_00.ptr = (String *)AVar1.size_;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)AVar1.ptr,argValues_00);
  local_b0 = &argValues[1].content.disposer;
  do {
    local_b0 = local_b0 + -3;
    String::~String((String *)local_b0);
  } while (local_b0 != (ArrayDisposer **)local_58);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}